

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Source.cpp
# Opt level: O0

void __thiscall
helics::apps::Source::linkPublicationToGenerator(Source *this,string_view key,string_view generator)

{
  string_view message;
  bool bVar1;
  size_t sVar2;
  pointer ppVar3;
  reference pvVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  long in_RDI;
  iterator findGen;
  iterator fnd;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  int iVar5;
  char *pcVar6;
  _Self in_stack_ffffffffffffff50;
  _Self in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 uVar7;
  undefined4 in_stack_ffffffffffffff64;
  char local_89 [65];
  __sv_type local_48;
  _Self local_38;
  _Self local_30 [6];
  
  local_30[0]._M_node =
       (_Base_ptr)
       CLI::std::
       map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
       ::find((map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
               *)in_stack_ffffffffffffff18,(key_type *)0x4093d0);
  local_38._M_node =
       (_Base_ptr)
       CLI::std::
       map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
       ::end((map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
              *)in_stack_ffffffffffffff18);
  bVar1 = CLI::std::operator==(local_30,&local_38);
  if (!bVar1) {
    CLI::std::
    map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
    ::find((map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
            *)in_stack_ffffffffffffff18,(key_type *)0x40953f);
    CLI::std::
    map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
    ::end((map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
           *)in_stack_ffffffffffffff18);
    bVar1 = CLI::std::operator==
                      ((_Self *)&stack0xffffffffffffff58,(_Self *)&stack0xffffffffffffff50);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 0xa0)
      ;
      CLI::std::
      _Rb_tree_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>
      ::operator->((_Rb_tree_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>
                    *)0x4095d9);
      CLI::std::deque<helics::apps::SourceObject,_std::allocator<helics::apps::SourceObject>_>::
      operator[]((deque<helics::apps::SourceObject,_std::allocator<helics::apps::SourceObject>_> *)
                 this_00,(size_type)in_stack_ffffffffffffff18);
      std::__cxx11::string::operator=(this_00,in_stack_ffffffffffffff18);
    }
    else {
      ppVar3 = CLI::std::
               _Rb_tree_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>
                             *)0x40957b);
      iVar5 = ppVar3->second;
      CLI::std::
      _Rb_tree_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>
      ::operator->((_Rb_tree_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>
                    *)0x4095a2);
      pvVar4 = CLI::std::
               deque<helics::apps::SourceObject,_std::allocator<helics::apps::SourceObject>_>::
               operator[]((deque<helics::apps::SourceObject,_std::allocator<helics::apps::SourceObject>_>
                           *)in_stack_ffffffffffffff20,(size_type)in_stack_ffffffffffffff18);
      pvVar4->generatorIndex = iVar5;
    }
    return;
  }
  uVar7 = CONCAT13(1,(int3)in_stack_ffffffffffffff60);
  sVar2 = __cxa_allocate_exception(0x28);
  pcVar6 = local_89;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffff64,uVar7),
             (basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff58._M_node,
             (allocator<char> *)in_stack_ffffffffffffff50._M_node);
  std::operator+(in_stack_ffffffffffffff28,(char *)in_stack_ffffffffffffff20);
  local_48 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffff20);
  message._M_str = pcVar6;
  message._M_len = sVar2;
  InvalidParameter::InvalidParameter
            ((InvalidParameter *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
             message);
  __cxa_throw(sVar2,&InvalidParameter::typeinfo,InvalidParameter::~InvalidParameter);
}

Assistant:

void Source::linkPublicationToGenerator(std::string_view key, std::string_view generator)
    {
        auto fnd = pubids.find(key);
        if (fnd == pubids.end()) {
            // only get here if something wasn't found
            throw(
                InvalidParameter(std::string(key) + " was not recognized as a valid publication"));
        }
        auto findGen = generatorLookup.find(generator);
        if (findGen != generatorLookup.end()) {
            sources[fnd->second].generatorIndex = findGen->second;
            return;
        }
        sources[fnd->second].generatorName = generator;
    }